

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O3

RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *
capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::reducePromise
          (RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>
           *__return_storage_ptr__,
          Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
          *promise)

{
  SourceLocation location;
  PromiseBase node;
  OwnPromiseNode node_00;
  PromiseArenaMember *node_01;
  Tuple<kj::Promise<Response<GetCapResults>_>,_kj::Promise<kj::Own<PipelineHook>_>_> splitPromise;
  void *continuationTracePtr;
  anon_class_1_0_00000001_for_func local_59;
  PromiseBase local_58;
  OwnPromiseNode local_50;
  PromiseArenaMember *local_48;
  char *local_40;
  char *pcStack_38;
  undefined8 local_30;
  Disposer *local_28;
  PipelineHook *pPStack_20;
  
  local_28 = (Disposer *)
             kj::_::
             SimpleTransformPromiseNode<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.h:1064:20)>
             ::anon_class_1_0_00000001_for_func::operator();
  kj::_::PromiseDisposer::
  appendPromise<kj::_::SimpleTransformPromiseNode<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>,capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::reducePromise(kj::Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>>&&)::_lambda(capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>&&)_1_>,kj::_::PromiseDisposer,capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::reducePromise(kj::Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>>&&)::_lambda(capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>&&)_1_,void*&>
            ((PromiseDisposer *)&local_48,(OwnPromiseNode *)promise,&local_59,&local_28);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.h"
  ;
  pcStack_38 = "reducePromise";
  local_30 = 0x700000428;
  location.function = "reducePromise";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.h"
  ;
  location.lineNumber = 0x428;
  location.columnNumber = 7;
  kj::
  Promise<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook,_std::nullptr_t>_>_>
  ::split((Promise<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook,_std::nullptr_t>_>_>
           *)&local_58,location);
  node_01 = local_48;
  if (local_48 != (PromiseArenaMember *)0x0) {
    local_48 = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose(node_01);
  }
  newLocalPromisePipeline
            ((capnp *)&local_28,(Promise<kj::Own<capnp::PipelineHook,_std::nullptr_t>_> *)&local_50)
  ;
  node_00.ptr = local_50.ptr;
  (__return_storage_ptr__->
  super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>).
  super_PromiseBase.node.ptr = (PromiseNode *)local_58.node.ptr;
  local_58.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
  (__return_storage_ptr__->super_Pipeline)._typeless.hook.disposer = local_28;
  (__return_storage_ptr__->super_Pipeline)._typeless.hook.ptr = pPStack_20;
  (__return_storage_ptr__->super_Pipeline)._typeless.ops.ptr = (PipelineOp *)0x0;
  (__return_storage_ptr__->super_Pipeline)._typeless.ops.size_ = 0;
  (__return_storage_ptr__->super_Pipeline)._typeless.ops.disposer = (ArrayDisposer *)0x0;
  if (&(local_50.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_50.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node_00.ptr)->super_PromiseArenaMember);
    node.node.ptr = local_58.node.ptr;
    if (local_58.node.ptr != (PromiseNode *)0x0) {
      local_58.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.node.ptr);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RemotePromise<T> RemotePromise<T>::reducePromise(kj::Promise<RemotePromise>&& promise) {
  kj::Tuple<kj::Promise<Response<T>>, kj::Promise<kj::Own<PipelineHook>>> splitPromise =
      promise.then([](RemotePromise&& inner) {
    // `inner` is multiply-inherited, and we want to move away each superclass separately.
    // Let's create two references to make clear what we're doing (though this is not strictly
    // necessary).
    kj::Promise<Response<T>>& innerPromise = inner;
    typename T::Pipeline& innerPipeline = inner;
    return kj::tuple(kj::mv(innerPromise), PipelineHook::from(kj::mv(innerPipeline)));
  }).split();

  return RemotePromise(kj::mv(kj::get<0>(splitPromise)),
      typename T::Pipeline(AnyPointer::Pipeline(
          newLocalPromisePipeline(kj::mv(kj::get<1>(splitPromise))))));
}